

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void diag_and_floor(vector_t *fullvar,uint32 veclen,float32 floor)

{
  uint local_20;
  uint local_1c;
  uint32 j;
  uint32 i;
  float32 floor_local;
  uint32 veclen_local;
  vector_t *fullvar_local;
  
  for (local_1c = 0; local_1c < veclen; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < veclen; local_20 = local_20 + 1) {
      if (local_1c == local_20) {
        if (fullvar[local_1c][local_20] < (float)floor) {
          fullvar[local_1c][local_20] = (float)floor;
        }
      }
      else {
        fullvar[local_1c][local_20] = 0.0;
      }
    }
  }
  return;
}

Assistant:

static void
diag_and_floor(vector_t *fullvar, uint32 veclen, float32 floor)
{
    uint32 i, j;
    for (i = 0; i < veclen; ++i) {
	for (j = 0; j < veclen; ++j) {
	    if (i != j)
		fullvar[i][j] = 0.0;
	    else {
		if (fullvar[i][j] < floor)
		    fullvar[i][j] = floor;
	    }
	}
    }
}